

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  int iVar1;
  int fCompl;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int Value;
  int i;
  Gia_Obj_t *pTemp;
  Vec_Int_t *vPat_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  Gia_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Vec_IntSize(vPat), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vPat,local_2c);
    iVar1 = Abc_Lit2Var(iVar1);
    pGVar2 = Gia_ManCi(p,iVar1);
    if ((*(ulong *)pGVar2 >> 0x3e & 1) == 0) {
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xbfffffffffffffff;
    }
    else {
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xbfffffffffffffff | 0x4000000000000000;
    }
    Gia_ObjSetTravIdCurrent(p,pGVar2);
  }
  pGVar2 = Gia_ObjFanin0(pObj);
  iVar1 = Cec_ManPatComputePattern3_rec(p,pGVar2);
  fCompl = Gia_ObjFaninC0(pObj);
  iVar1 = Gia_XsimNotCond(iVar1,fCompl);
  if (iVar1 == 2) {
    return;
  }
  Abc_Print(1,"Cec_ManPatVerifyPattern(): Verification failed.\n");
  __assert_fail("Value == GIA_ONE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                ,0x12f,"void Cec_ManPatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Cec_ManPatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    Gia_Obj_t * pTemp;
    int i, Value;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        pTemp = Gia_ManCi( p, Abc_Lit2Var(Value) );
//        assert( Abc_LitIsCompl(Value) != (int)pTemp->fMark1 );
        if ( pTemp->fMark1 )
        {
            pTemp->fMark0 = 0;
            pTemp->fMark1 = 1;
        }
        else
        {
            pTemp->fMark0 = 1;
            pTemp->fMark1 = 0;
        }
        Gia_ObjSetTravIdCurrent( p, pTemp );
    }
    Value = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pObj) );
    if ( Value != GIA_ONE )
        Abc_Print( 1, "Cec_ManPatVerifyPattern(): Verification failed.\n" );
    assert( Value == GIA_ONE );
}